

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-rb.c
# Opt level: O3

void pp_tree_rb_balance_remove(PTreeRBNode *node,PTreeBaseNode **root)

{
  PTreeBaseNode_ *pPVar1;
  PTreeBaseNode_ *pPVar2;
  PTreeRBNode *node_00;
  PTreeRBNode *node_01;
  PTreeRBNode *pPVar3;
  PTreeRBNode_ *pPVar4;
  PTreeRBNode_ **ppPVar5;
  
  node_01 = node->parent;
  if (node_01 != (PTreeRBNode *)0x0) {
    ppPVar5 = &node->parent;
    do {
      node_00 = (PTreeRBNode *)(node_01->base).left;
      pPVar4 = node_01;
      if (node_00 == node) {
        node_00 = (PTreeRBNode *)(node_01->base).right;
        pPVar3 = node;
        if ((node_00->color & P_TREE_RB_COLOR_RED) != 0) {
          node_01->color = P_TREE_RB_COLOR_RED;
          node_00->color = P_TREE_RB_COLOR_BLACK;
          pp_tree_rb_rotate_left(node_01,root);
          goto LAB_0010ad12;
        }
      }
      else {
        pPVar3 = node_00;
        if ((node_00->color & P_TREE_RB_COLOR_RED) != 0) {
          node_01->color = P_TREE_RB_COLOR_RED;
          node_00->color = P_TREE_RB_COLOR_BLACK;
          pp_tree_rb_rotate_right(node_01,root);
LAB_0010ad12:
          pPVar4 = *ppPVar5;
          node_00 = (PTreeRBNode *)(pPVar4->base).left;
          pPVar3 = node_00;
          if (node_00 == node) {
            node_00 = (PTreeRBNode *)(pPVar4->base).right;
            pPVar3 = node;
          }
        }
      }
      pPVar1 = (node_00->base).left;
      if (((pPVar1 != (PTreeBaseNode_ *)0x0) && (((ulong)pPVar1[1].right & 2) == 0)) ||
         ((pPVar2 = (node_00->base).right, pPVar2 != (PTreeBaseNode_ *)0x0 &&
          (((ulong)pPVar2[1].right & 2) == 0)))) {
        if ((node == pPVar3) &&
           ((pPVar2 = (node_00->base).right, pPVar2 == (PTreeBaseNode_ *)0x0 ||
            (((ulong)pPVar2[1].right & 2) != 0)))) {
          node_00->color = P_TREE_RB_COLOR_RED;
          *(undefined4 *)&pPVar1[1].right = 2;
          pp_tree_rb_rotate_right(node_00,root);
        }
        else {
          if ((node != (PTreeRBNode *)(pPVar4->base).right) ||
             ((pPVar1 != (PTreeBaseNode_ *)0x0 && (((ulong)pPVar1[1].right & 2) == 0))))
          goto LAB_0010adac;
          node_00->color = P_TREE_RB_COLOR_RED;
          *(undefined4 *)&(node_00->base).right[1].right = 2;
          pp_tree_rb_rotate_left(node_00,root);
        }
        pPVar4 = *ppPVar5;
        node_00 = (PTreeRBNode *)(pPVar4->base).left;
        pPVar3 = node_00;
        if (node_00 == node) {
          node_00 = (PTreeRBNode *)(pPVar4->base).right;
          pPVar3 = node;
        }
LAB_0010adac:
        node_00->color = pPVar4->color;
        pPVar4->color = P_TREE_RB_COLOR_BLACK;
        if (node == pPVar3) {
          *(undefined4 *)&(node_00->base).right[1].right = 2;
          pp_tree_rb_rotate_left(pPVar4,root);
          return;
        }
        *(undefined4 *)&(node_00->base).left[1].right = 2;
        pp_tree_rb_rotate_right(pPVar4,root);
        return;
      }
      node_00->color = P_TREE_RB_COLOR_RED;
      if ((pPVar4->color & P_TREE_RB_COLOR_BLACK) == 0) {
        pPVar4->color = P_TREE_RB_COLOR_BLACK;
        return;
      }
      ppPVar5 = &pPVar4->parent;
      node_01 = pPVar4->parent;
      node = pPVar4;
    } while (node_01 != (PTreeRBNode_ *)0x0);
  }
  return;
}

Assistant:

static void
pp_tree_rb_balance_remove (PTreeRBNode *node, PTreeBaseNode **root)
{
	PTreeRBNode *sibling;

	while (TRUE) {
		/* Case 1: We are at the root */
		if (P_UNLIKELY (node->parent == NULL))
			break;

		sibling = pp_tree_rb_get_sibling (node);

		if (pp_tree_rb_is_red (sibling) == TRUE) {
			/*
			 * Case 2: Left (right) rotate at parent
			 *
			 *     P               S
			 *    / \             / \
			 *   N   s    -->    p   Sr
			 *      / \         / \
			 *     Sl  Sr      N   Sl
			 */
			node->parent->color = P_TREE_RB_COLOR_RED;
			sibling->color      = P_TREE_RB_COLOR_BLACK;

			if ((PTreeBaseNode *) node == node->parent->base.left)
				pp_tree_rb_rotate_left (node->parent, root);
			else
				pp_tree_rb_rotate_right (node->parent, root);

			sibling = pp_tree_rb_get_sibling (node);
		}

		/*
		 * Case 3: Sibling (parent) color flip
		 *
		 *    (p)           (p)
		 *    / \           / \
		 *   N   S    -->  N   s
		 *      / \           / \
		 *     Sl  Sr        Sl  Sr
		 */
		if (pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.left)  == TRUE &&
		    pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.right) == TRUE) {
			sibling->color = P_TREE_RB_COLOR_RED;

			if (pp_tree_rb_is_black (node->parent) == TRUE) {
				node = node->parent;
				continue;
			} else {
				node->parent->color = P_TREE_RB_COLOR_BLACK;
				break;
			}
		}

		/*
		 * Case 4: Right (left) rotate at sibling
		 *
		 *   (p)           (p)
		 *   / \           / \
		 *  N   S    -->  N   Sl
		 *     / \             \
		 *    sl  Sr            s
		 *                       \
		 *                        Sr
		 */
		if ((PTreeBaseNode *) node == node->parent->base.left &&
		    pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.right) == TRUE) {
			sibling->color = P_TREE_RB_COLOR_RED;
			((PTreeRBNode *) sibling->base.left)->color = P_TREE_RB_COLOR_BLACK;

			pp_tree_rb_rotate_right (sibling, root);

			sibling = pp_tree_rb_get_sibling (node);
		} else if ((PTreeBaseNode *) node == node->parent->base.right &&
			   pp_tree_rb_is_black ((PTreeRBNode *) sibling->base.left) == TRUE) {
			sibling->color = P_TREE_RB_COLOR_RED;
			((PTreeRBNode *) sibling->base.right)->color = P_TREE_RB_COLOR_BLACK;

			pp_tree_rb_rotate_left (sibling, root);

			sibling = pp_tree_rb_get_sibling (node);
		}

		/*
		 * Case 5: Left (right) rotate at parent and color flips
		 *
		 *      (p)             (s)
		 *      / \             / \
		 *     N   S     -->   P   Sr
		 *        / \         / \
		 *      (sl) sr      N  (sl)
		 */
		sibling->color      = node->parent->color;
		node->parent->color = P_TREE_RB_COLOR_BLACK;

		if ((PTreeBaseNode *) node == node->parent->base.left) {
			((PTreeRBNode *) sibling->base.right)->color = P_TREE_RB_COLOR_BLACK;
			pp_tree_rb_rotate_left (node->parent, root);
		} else {
			((PTreeRBNode *) sibling->base.left)->color = P_TREE_RB_COLOR_BLACK;
			pp_tree_rb_rotate_right (node->parent, root);
		}

		break;
	}
}